

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationarrow.cpp
# Opt level: O1

void __thiscall QtMWidgets::NavigationArrow::paintEvent(NavigationArrow *this,QPaintEvent *param_1)

{
  Direction DVar1;
  long lVar2;
  NavigationArrowPrivate *pNVar3;
  QPainter p;
  QRect r;
  undefined1 auStack_38 [12];
  int iStack_2c;
  uint local_28;
  uint uStack_24;
  double local_20;
  double local_18;
  
  QPainter::QPainter((QPainter *)auStack_38,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)auStack_38,true);
  lVar2 = *(long *)&this->field_0x20;
  local_28 = *(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14);
  uStack_24 = *(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18);
  stack0xffffffffffffffd0 = 0.0;
  pNVar3 = (this->d).d;
  if (pNVar3->direction == Right) {
    drawArrow((QPainter *)auStack_38,(QRect *)(auStack_38 + 8),&pNVar3->color);
  }
  pNVar3 = (this->d).d;
  DVar1 = pNVar3->direction;
  if (DVar1 != Bottom) {
    if (DVar1 != Top) {
      if (DVar1 == Left) {
        QPainter::rotate(180.0);
        local_20 = (double)(int)(~local_28 + auStack_38._8_4_);
        local_18 = (double)(int)(~uStack_24 + iStack_2c);
        QPainter::translate((QPointF *)auStack_38);
        drawArrow((QPainter *)auStack_38,(QRect *)(auStack_38 + 8),&((this->d).d)->color);
      }
      goto LAB_0015bd57;
    }
    QPainter::rotate(180.0);
    local_20 = (double)(int)(~local_28 + auStack_38._8_4_);
    local_18 = (double)(int)(~uStack_24 + iStack_2c);
    QPainter::translate((QPointF *)auStack_38);
    pNVar3 = (this->d).d;
  }
  drawArrow2((QPainter *)auStack_38,(QRect *)(auStack_38 + 8),&pNVar3->color);
LAB_0015bd57:
  QPainter::~QPainter((QPainter *)auStack_38);
  return;
}

Assistant:

void
NavigationArrow::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );

	const QRect r = rect();

	if( d->direction == Right )
		drawArrow( &p, r, d->color );
	if( d->direction == Left )
	{
		p.rotate( 180 );
		p.translate( - r.width(), - r.height() );

		drawArrow( &p, r, d->color );
	}
	else if( d->direction == Top )
	{
		p.rotate( 180 );
		p.translate( - r.width(), - r.height() );

		drawArrow2( &p, r, d->color );
	}
	else if( d->direction == Bottom )
		drawArrow2( &p, r, d->color );
}